

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0177e398;
  TPZIntelGen<pzshape::TPZShapeLinear>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeLinear>,&PTR_PTR_0177be20);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_0177ba50;
  local_20 = -1;
  TPZManVector<long,_1>::TPZManVector(&this->fConnectIndexes,1,&local_20);
  this->fhcurlfam = EHCurlStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  *(this->fConnectIndexes).super_TPZVec<long>.fStore = -1;
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl() :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides-TSHAPE::NCornerNodes;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}